

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::CopyBits(BVFixed *this,BVFixed *bv,BVIndex i)

{
  code *pcVar1;
  BVFixed *pBVar2;
  BOOLEAN BVar3;
  BOOLEAN BVar4;
  bool bVar5;
  BVIndex BVar6;
  uint uVar7;
  BVIndex BVar8;
  uint *puVar9;
  ulong uVar10;
  undefined4 *puVar11;
  uint local_4c;
  BVIndex curr;
  BVFixed local_40;
  BVUnit temp;
  BVIndex j;
  BVIndex pos;
  uint local_28;
  BVIndex copylen;
  BVIndex len;
  BVIndex position;
  BVIndex offset;
  BVIndex i_local;
  BVFixed *bv_local;
  BVFixed *this_local;
  
  position = i;
  _offset = bv;
  bv_local = this;
  AssertBV(this,bv);
  len = BVUnitT<unsigned_long>::Offset(position);
  copylen = BVUnitT<unsigned_long>::Position(position);
  BVar6 = WordCount(_offset);
  local_28 = BVar6 - copylen;
  j = WordCount(this);
  puVar9 = min<unsigned_int>(&j,&local_28);
  pBVar2 = _offset;
  pos = *puVar9;
  if (len == 0) {
    uVar10 = (ulong)pos;
    BVar6 = BVUnitT<unsigned_long>::Position(position);
    js_memcpy_s(this + 1,uVar10 << 3,pBVar2 + (ulong)BVar6 + 1,(ulong)pos << 3);
  }
  else {
    temp.word._4_4_ = copylen;
    for (temp.word._0_4_ = 0; uVar7 = temp.word._4_4_, (uint)temp.word < pos;
        temp.word._0_4_ = (uint)temp.word + 1) {
      BVar6 = WordCount(_offset);
      if (BVar6 <= uVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                           ,0x10d,"(pos < bv->WordCount())","pos < bv->WordCount()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      this[(ulong)(uint)temp.word + 1] = _offset[(ulong)temp.word._4_4_ + 1];
      BVUnitT<unsigned_long>::ShiftRight
                ((BVUnitT<unsigned_long> *)(this + (ulong)(uint)temp.word + 1),len);
      uVar7 = temp.word._4_4_ + 1;
      temp.word._4_4_ = uVar7;
      BVar6 = WordCount(_offset);
      if (BVar6 <= uVar7) break;
      local_40 = _offset[(ulong)temp.word._4_4_ + 1];
      BVUnitT<unsigned_long>::ShiftLeft((BVUnitT<unsigned_long> *)&local_40,0x40 - len);
      BVUnitT<unsigned_long>::Or
                ((BVUnitT<unsigned_long> *)(this + (ulong)(uint)temp.word + 1),
                 (BVUnitT<unsigned_long>)local_40);
    }
  }
  local_4c = position;
  do {
    BVar6 = position;
    BVar8 = Length(this);
    if (BVar6 + BVar8 <= local_4c) {
      return;
    }
    BVar3 = Test(this,local_4c - position);
    BVar4 = Test(_offset,local_4c);
    if (BVar3 != BVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                         ,0x11e,"(this->Test(curr - i) == bv->Test(curr))",
                         "this->Test(curr - i) == bv->Test(curr)");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void
BVFixed::CopyBits(const BVFixed * bv, BVIndex i)
{
    AssertBV(bv);
    BVIndex offset = BVUnit::Offset(i);
    BVIndex position = BVUnit::Position(i);
    BVIndex len = bv->WordCount() - position;
    BVIndex copylen = min(WordCount(), len);
    if (offset == 0)
    {
        js_memcpy_s(&this->data[0], copylen * sizeof(BVUnit), &bv->data[BVUnit::Position(i)], copylen * sizeof(BVUnit));
    }
    else
    {
        BVIndex pos = position;
        for (BVIndex j = 0; j < copylen; j++)
        {
            Assert(pos < bv->WordCount());
            this->data[j] = bv->data[pos];
            this->data[j].ShiftRight(offset);

            pos++;
            if (pos >= bv->WordCount())
            {
                break;
            }
            BVUnit temp = bv->data[pos];
            temp.ShiftLeft(BVUnit::BitsPerWord - offset);
            this->data[j].Or(temp);
        }
    }
#if DBG
    for (BVIndex curr = i; curr < i + this->Length(); curr++)
    {
        Assert(this->Test(curr - i) == bv->Test(curr));
    }
#endif
}